

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAPSFile.cpp
# Opt level: O1

uint ExtractInt(uchar *in)

{
  uint uVar1;
  
  uVar1 = *(uint *)in;
  return uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
}

Assistant:

unsigned int ExtractInt(const unsigned char* in)
{
   unsigned int return_value;
#ifdef BIG_ENDIAN
   return_value = in[3]
      + (in[2] << 8)
      + (in[1] << 16)
      + (in[0] << 24);
#else
   return_value = in[0]
      + (in[1] << 8)
      + (in[2] << 16)
      + (in[3] << 24);

#endif

   return return_value;
}